

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclSize.c
# Opt level: O2

int Abc_SclTimeIncUpdate(SC_Man *p)

{
  SC_Pair *pSVar1;
  float fVar2;
  Abc_Ntk_t *pAVar3;
  SC_Pair *pSVar4;
  Abc_Obj_t *pAVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  Abc_Obj_t *pAVar9;
  Vec_Int_t *pVVar10;
  SC_Cell *pCell;
  SC_Timing *pTime;
  int i;
  long lVar11;
  int iVar12;
  float E;
  float E_00;
  float fVar13;
  float extraout_XMM0_Da;
  float extraout_XMM0_Da_00;
  SC_Pair ArrOut;
  SC_Pair SlewOut;
  SC_Pair local_50;
  int local_44;
  Vec_Int_t *local_40;
  SC_Pair local_38;
  
  pVVar10 = p->vChanged;
  iVar6 = pVVar10->nSize;
  if (iVar6 == 0) {
    iVar6 = 0;
  }
  else {
    for (iVar12 = 0; iVar12 < iVar6; iVar12 = iVar12 + 1) {
      pAVar3 = p->pNtk;
      iVar6 = Vec_IntEntry(pVVar10,iVar12);
      pAVar9 = Abc_NtkObj(pAVar3,iVar6);
      if ((pAVar9 != (Abc_Obj_t *)0x0) &&
         (Abc_SclTimeIncAddFanins(p,pAVar9), (pAVar9->field_0x14 & 0x40) == 0)) {
        Abc_SclTimeIncAddNode(p,pAVar9);
      }
      pVVar10 = p->vChanged;
      iVar6 = pVVar10->nSize;
    }
    pVVar10->nSize = 0;
    for (iVar6 = 0; iVar6 < p->vLevels->nSize; iVar6 = iVar6 + 1) {
      pVVar10 = Vec_WecEntry(p->vLevels,iVar6);
      for (iVar12 = 0; iVar12 < pVVar10->nSize; iVar12 = iVar12 + 1) {
        pAVar3 = p->pNtk;
        iVar7 = Vec_IntEntry(pVVar10,iVar12);
        pAVar9 = Abc_NtkObj(pAVar3,iVar7);
        if (pAVar9 != (Abc_Obj_t *)0x0) {
          if ((*(uint *)&pAVar9->field_0x14 & 0xf) - 5 < 0xfffffffe) {
            uVar8 = pAVar9->Id;
            pSVar4 = p->pSlews;
            pSVar1 = p->pTimes + uVar8;
            local_50 = *pSVar1;
            pSVar1->rise = 0.0;
            pSVar1->fall = 0.0;
            local_38 = pSVar4[uVar8];
            pSVar4[uVar8].rise = 0.0;
            pSVar4[uVar8].fall = 0.0;
            Abc_SclTimeNode(p,pAVar9,0);
            iVar7 = SC_PairEqualE(&local_50,pSVar1,E);
            if ((iVar7 == 0) || (iVar7 = SC_PairEqualE(&local_38,pSVar4 + uVar8,E_00), iVar7 == 0))
            {
              for (lVar11 = 0; lVar11 < (pAVar9->vFanouts).nSize; lVar11 = lVar11 + 1) {
                pAVar5 = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanouts).pArray[lVar11]]
                ;
                uVar8 = *(uint *)&pAVar5->field_0x14;
                if ((uVar8 & 0xf) != 8 && (char)((uVar8 & 0x40) >> 6) == '\0') {
                  Abc_SclTimeIncAddNode(p,pAVar5);
                }
              }
            }
          }
          else {
            Abc_SclObjDupFanin(p,pAVar9);
            fVar13 = p->pTimes[(uint)pAVar9->Id].rise;
            fVar2 = p->pTimes[(uint)pAVar9->Id].fall;
            if (fVar13 <= fVar2) {
              fVar13 = fVar2;
            }
            Vec_FltWriteEntry(p->vTimesOut,(pAVar9->field_5).iData,fVar13);
            Vec_QueUpdate(p->vQue,(pAVar9->field_5).iData);
          }
        }
      }
    }
    fVar13 = Abc_SclReadMaxDelay(p);
    p->MaxDelay = fVar13;
    iVar6 = p->vLevels->nSize;
    while (0 < iVar6) {
      local_44 = iVar6 + -1;
      local_40 = Vec_WecEntry(p->vLevels,local_44);
      for (iVar12 = 0; iVar6 = local_44, iVar12 < local_40->nSize; iVar12 = iVar12 + 1) {
        pAVar3 = p->pNtk;
        iVar6 = Vec_IntEntry(local_40,iVar12);
        pAVar9 = Abc_NtkObj(pAVar3,iVar6);
        if (pAVar9 != (Abc_Obj_t *)0x0) {
          pSVar1 = p->pDepts + (uint)pAVar9->Id;
          local_50 = *pSVar1;
          pSVar1->rise = 0.0;
          pSVar1->fall = 0.0;
          fVar13 = extraout_XMM0_Da;
          for (lVar11 = 0; lVar11 < (pAVar9->vFanouts).nSize; lVar11 = lVar11 + 1) {
            pAVar5 = (Abc_Obj_t *)pAVar9->pNtk->vObjs->pArray[(pAVar9->vFanouts).pArray[lVar11]];
            uVar8 = *(uint *)&pAVar5->field_0x14 & 0xf;
            if ((8 < uVar8) || ((0x118U >> uVar8 & 1) == 0)) {
              pCell = Abc_SclObjCell(pAVar5);
              iVar6 = Abc_NodeFindFanin(pAVar5,pAVar9);
              pTime = Scl_CellPinTime(pCell,iVar6);
              Abc_SclDeptFanin(p,pTime,pAVar5,pAVar9);
              fVar13 = extraout_XMM0_Da_00;
            }
          }
          iVar6 = SC_PairEqualE(&local_50,pSVar1,fVar13);
          if (iVar6 == 0) {
            Abc_SclTimeIncAddFanins(p,pAVar9);
          }
        }
      }
    }
    fVar13 = Abc_SclReadMaxDelay(p);
    p->MaxDelay = fVar13;
    for (iVar6 = 0; iVar6 < p->vLevels->nSize; iVar6 = iVar6 + 1) {
      pVVar10 = Vec_WecEntry(p->vLevels,iVar6);
      for (iVar12 = 0; iVar12 < pVVar10->nSize; iVar12 = iVar12 + 1) {
        pAVar3 = p->pNtk;
        iVar7 = Vec_IntEntry(pVVar10,iVar12);
        pAVar9 = Abc_NtkObj(pAVar3,iVar7);
        if (pAVar9 != (Abc_Obj_t *)0x0) {
          if ((*(uint *)&pAVar9->field_0x14 & 0x40) == 0) {
            __assert_fail("pObj->fMarkC == 1",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/map/scl/sclSize.c"
                          ,0x1c1,"void Abc_SclTimeIncUpdateClean(SC_Man *)");
          }
          *(uint *)&pAVar9->field_0x14 = *(uint *)&pAVar9->field_0x14 & 0xffffffbf;
        }
      }
      pVVar10->nSize = 0;
    }
    iVar6 = p->nIncUpdates;
    p->nIncUpdates = 0;
  }
  return iVar6;
}

Assistant:

int Abc_SclTimeIncUpdate( SC_Man * p )
{
    Abc_Obj_t * pObj;
    int i, RetValue;
    if ( Vec_IntSize(p->vChanged) == 0 )
        return 0;
//    Abc_SclTimeIncCheckLevel( p->pNtk );
    Abc_NtkForEachObjVec( p->vChanged, p->pNtk, pObj, i )
    {
        Abc_SclTimeIncAddFanins( p, pObj );
        if ( pObj->fMarkC )
            continue;
        Abc_SclTimeIncAddNode( p, pObj );
    }
    Vec_IntClear( p->vChanged );
    Abc_SclTimeIncUpdateArrival( p );
    Abc_SclTimeIncUpdateDeparture( p );
    Abc_SclTimeIncUpdateClean( p );
    RetValue = p->nIncUpdates;
    p->nIncUpdates = 0;
    return RetValue;
}